

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

bdecode_node * __thiscall
libtorrent::bdecode(bdecode_node *__return_storage_ptr__,libtorrent *this,span<const_char> buffer,
                   error_code *ec,int *error_pos,int depth_limit,int token_limit)

{
  stack_frame sVar1;
  long lVar2;
  char cVar3;
  char cVar4;
  bdecode_node *pbVar5;
  span<libtorrent::(anonymous_namespace)::stack_frame> *this_00;
  stack_frame *first;
  error_code_enum eVar6;
  char *pcVar7;
  int iVar8;
  index_type iVar9;
  long lVar10;
  stack_frame *last;
  char *pcVar11;
  reference pvVar12;
  size_type sVar13;
  bdecode_token *pbVar14;
  error_code *this_01;
  size_type __n;
  undefined8 uStack_280;
  bdecode_node *local_278;
  uint local_26c;
  bdecode_node *local_268;
  stack_frame *local_260;
  bdecode_node *local_258;
  bdecode_node *local_250;
  stack_frame *local_248;
  bdecode_node *local_240;
  stack_frame *local_238;
  uint local_22c;
  stack_frame *local_228;
  stack_frame *local_220;
  bdecode_node *local_218;
  stack_frame *local_210;
  bdecode_node *local_208;
  char *local_200;
  undefined1 local_1f5;
  uint local_1f4;
  stack_frame *local_1f0;
  bdecode_node *local_1e8;
  stack_frame *local_1e0;
  bdecode_node *local_1d8;
  stack_frame *local_1d0;
  bdecode_node *local_1c8;
  char *local_1c0;
  bdecode_node *local_1b8;
  stack_frame *local_1b0;
  bdecode_node *local_1a8;
  stack_frame *local_1a0;
  ulong local_198;
  undefined1 local_189;
  stack_frame *local_188;
  bdecode_node *local_180;
  stack_frame *local_178;
  char *local_170;
  span<libtorrent::(anonymous_namespace)::stack_frame> *local_168;
  stack_frame *local_160;
  long local_158;
  bdecode_node *local_150;
  bdecode_node *local_148;
  bdecode_token local_13c;
  bdecode_token local_134;
  uint local_12c;
  int top_1;
  bdecode_token local_120;
  bdecode_token local_118;
  char *local_110;
  ptrdiff_t buff_size;
  char *pcStack_100;
  error_code_enum e_1;
  char *str_start;
  int64_t len;
  int top;
  bdecode_token local_e4;
  error_code_enum local_dc;
  char *pcStack_d8;
  error_code_enum e;
  char *int_start;
  stack_frame local_c8;
  bdecode_token local_c4;
  stack_frame local_bc;
  int local_b8;
  char local_b1;
  int current_frame;
  char t;
  char *orig_start;
  char *end;
  char *start;
  alloca_destructor<libtorrent::(anonymous_namespace)::stack_frame> stack_destructor;
  stack_frame *TORRENT_ALLOCA_tmp;
  long TORRENT_ALLOCA_size;
  span<libtorrent::(anonymous_namespace)::stack_frame> stack;
  int local_40;
  int sp;
  int depth_limit_local;
  int *error_pos_local;
  error_code *ec_local;
  span<const_char> buffer_local;
  bdecode_node *ret;
  
  this_01 = (error_code *)buffer.m_len;
  buffer_local.m_ptr = buffer.m_ptr;
  uStack_280 = 0x2137f0;
  local_150 = __return_storage_ptr__;
  local_148 = __return_storage_ptr__;
  ec_local = (error_code *)this;
  buffer_local.m_len = (difference_type)__return_storage_ptr__;
  bdecode_node::bdecode_node(__return_storage_ptr__);
  uStack_280 = 0x2137f9;
  boost::system::error_code::clear(this_01);
  uStack_280 = 0x213802;
  iVar9 = span<const_char>::size((span<const_char> *)&ec_local);
  if (iVar9 < 0x20000000) {
    local_40 = 0;
    uStack_280 = 0x213849;
    span<libtorrent::(anonymous_namespace)::stack_frame>::span
              ((span<libtorrent::(anonymous_namespace)::stack_frame> *)&TORRENT_ALLOCA_size);
    uStack_280 = 0x213851;
    lVar10 = aux::numeric_cast<long,int,void>((int)error_pos);
    lVar2 = -(lVar10 * 4 + 0xfU & 0xfffffffffffffff0);
    local_158 = lVar10;
    *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213893;
    span<libtorrent::(anonymous_namespace)::stack_frame>::span
              ((span<libtorrent::(anonymous_namespace)::stack_frame> *)
               &stack_destructor.objects.m_len,(stack_frame *)((long)&local_278 + lVar2),lVar10);
    TORRENT_ALLOCA_size = stack_destructor.objects.m_len;
    local_168 = (span<libtorrent::(anonymous_namespace)::stack_frame> *)&TORRENT_ALLOCA_size;
    *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2138ab;
    local_160 = span<libtorrent::(anonymous_namespace)::stack_frame>::begin
                          ((span<libtorrent::(anonymous_namespace)::stack_frame> *)
                           &TORRENT_ALLOCA_size);
    this_00 = local_168;
    *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2138be;
    last = span<libtorrent::(anonymous_namespace)::stack_frame>::end(this_00);
    first = local_160;
    *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2138cd;
    aux::uninitialized_default_construct<libtorrent::(anonymous_namespace)::stack_frame*>
              (first,last);
    *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2138df;
    span<libtorrent::(anonymous_namespace)::stack_frame>::
    span<libtorrent::span<libtorrent::(anonymous_namespace)::stack_frame>,libtorrent::(anonymous_namespace)::stack_frame,void>
              ((span<libtorrent::(anonymous_namespace)::stack_frame> *)&start,
               (span<libtorrent::(anonymous_namespace)::stack_frame> *)&TORRENT_ALLOCA_size);
    *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2138ea;
    local_170 = span<const_char>::data((span<const_char> *)&ec_local);
    end = local_170;
    *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213908;
    iVar9 = span<const_char>::size((span<const_char> *)&ec_local);
    orig_start = local_170 + iVar9;
    _current_frame = end;
    if (end == orig_start) {
      *(undefined8 *)((long)&uStack_280 + lVar2) = 0x21394a;
      boost::system::error_code::operator=(this_01,unexpected_eof);
      if (ec != (error_code *)0x0) {
        ec->val_ = (int)end - (int)_current_frame;
      }
    }
    else {
      do {
        if (orig_start < end) break;
        if (orig_start <= end) {
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2139b8;
          boost::system::error_code::operator=(this_01,unexpected_eof);
          if (ec != (error_code *)0x0) {
            ec->val_ = (int)end - (int)_current_frame;
          }
          break;
        }
        if ((int)error_pos <= local_40) {
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2139f5;
          boost::system::error_code::operator=(this_01,depth_exceeded);
          if (ec != (error_code *)0x0) {
            ec->val_ = (int)end - (int)_current_frame;
          }
          break;
        }
        depth_limit = depth_limit + -1;
        if (depth_limit < 0) {
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213a39;
          boost::system::error_code::operator=(this_01,limit_exceeded);
          if (ec != (error_code *)0x0) {
            ec->val_ = (int)end - (int)_current_frame;
          }
          break;
        }
        local_b1 = *end;
        local_b8 = local_40;
        if (0 < local_40) {
          local_180 = local_150;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213aa5;
          local_178 = span<libtorrent::(anonymous_namespace)::stack_frame>::operator[]
                                ((span<libtorrent::(anonymous_namespace)::stack_frame> *)
                                 &TORRENT_ALLOCA_size,(long)(local_40 + -1));
          pbVar5 = local_180;
          sVar1 = *local_178;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213acc;
          pvVar12 = std::
                    vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    ::operator[]((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                  *)pbVar5,(ulong)((uint)sVar1 & 0x7fffffff));
          if (((uint)((ulong)*pvVar12 >> 0x1d) & 7) == 1) {
            iVar8 = local_b8 + -1;
            *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213af4;
            local_188 = span<libtorrent::(anonymous_namespace)::stack_frame>::operator[]
                                  ((span<libtorrent::(anonymous_namespace)::stack_frame> *)
                                   &TORRENT_ALLOCA_size,(long)iVar8);
            cVar3 = local_b1;
            if (-1 < (int)*local_188) {
              *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213b1e;
              local_189 = anon_unknown_10::numeric(cVar3);
              if ((!(bool)local_189) && (local_b1 != 'e')) {
                *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213b4e;
                boost::system::error_code::operator=(this_01,expected_digit);
                if (ec != (error_code *)0x0) {
                  ec->val_ = (int)end - (int)_current_frame;
                }
                break;
              }
            }
          }
        }
        pcVar7 = orig_start;
        cVar3 = local_b1;
        pbVar5 = local_150;
        local_198 = (ulong)((int)local_b1 - 100);
        switch(local_198) {
        case 0:
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213bd5;
          sVar13 = std::
                   vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   ::size((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                           *)pbVar5);
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213be3;
          anon_unknown_10::stack_frame::stack_frame(&local_bc,(int)sVar13);
          lVar10 = (long)local_40;
          local_40 = local_40 + 1;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213bf9;
          local_1a0 = span<libtorrent::(anonymous_namespace)::stack_frame>::operator[]
                                ((span<libtorrent::(anonymous_namespace)::stack_frame> *)
                                 &TORRENT_ALLOCA_size,lVar10);
          *local_1a0 = local_bc;
          local_1a8 = local_150;
          lVar10 = (long)end - (long)_current_frame;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213c41;
          detail::bdecode_token::bdecode_token(&local_c4,lVar10,dict);
          pbVar5 = local_1a8;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213c56;
          std::
          vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
          ::push_back((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       *)pbVar5,&local_c4);
          end = end + 1;
          break;
        case 1:
          if (local_40 == 0) {
            *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213e57;
            boost::system::error_code::operator=(this_01,unexpected_eof);
            if (ec != (error_code *)0x0) {
              ec->val_ = (int)end - (int)_current_frame;
            }
            goto LAB_00214472;
          }
          if (0 < local_40) {
            local_1d8 = local_150;
            *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213ea5;
            local_1d0 = span<libtorrent::(anonymous_namespace)::stack_frame>::operator[]
                                  ((span<libtorrent::(anonymous_namespace)::stack_frame> *)
                                   &TORRENT_ALLOCA_size,(long)(local_40 + -1));
            pbVar5 = local_1d8;
            sVar1 = *local_1d0;
            *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213ecc;
            pvVar12 = std::
                      vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                      ::operator[]((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                    *)pbVar5,(ulong)((uint)sVar1 & 0x7fffffff));
            if (((uint)((ulong)*pvVar12 >> 0x1d) & 7) == 1) {
              *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213eed;
              local_1e0 = span<libtorrent::(anonymous_namespace)::stack_frame>::operator[]
                                    ((span<libtorrent::(anonymous_namespace)::stack_frame> *)
                                     &TORRENT_ALLOCA_size,(long)(local_40 + -1));
              if ((int)*local_1e0 < 0) {
                *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213f17;
                boost::system::error_code::operator=(this_01,expected_value);
                if (ec != (error_code *)0x0) {
                  ec->val_ = (int)end - (int)_current_frame;
                }
                goto LAB_00214472;
              }
            }
          }
          local_1e8 = local_150;
          lVar10 = (long)end - (long)_current_frame;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213f74;
          detail::bdecode_token::bdecode_token((bdecode_token *)((long)&len + 4),lVar10,1,end,'\0');
          pbVar5 = local_1e8;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213f89;
          std::
          vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
          ::push_back((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       *)pbVar5,(value_type *)((long)&len + 4));
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213f9c;
          local_1f0 = span<libtorrent::(anonymous_namespace)::stack_frame>::operator[]
                                ((span<libtorrent::(anonymous_namespace)::stack_frame> *)
                                 &TORRENT_ALLOCA_size,(long)(local_40 + -1));
          pbVar5 = local_150;
          len._0_4_ = (uint)*local_1f0 & 0x7fffffff;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213fc5;
          sVar13 = std::
                   vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   ::size((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                           *)pbVar5);
          pbVar5 = local_150;
          if (0x1fffffff < (int)((int)sVar13 - (uint)len)) {
            *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213fe2;
            boost::system::error_code::operator=(this_01,limit_exceeded);
            if (ec != (error_code *)0x0) {
              ec->val_ = (int)end - (int)_current_frame;
            }
            goto LAB_00214472;
          }
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x214013;
          sVar13 = std::
                   vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   ::size((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                           *)pbVar5);
          pbVar5 = local_150;
          local_1f4 = (int)sVar13 - (uint)len;
          sVar13 = (size_type)(int)(uint)len;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x214032;
          pvVar12 = std::
                    vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    ::operator[]((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                  *)pbVar5,sVar13);
          *pvVar12 = (value_type)
                     ((ulong)*pvVar12 & 0xe0000000ffffffff | ((ulong)local_1f4 & 0x1fffffff) << 0x20
                     );
          local_40 = local_40 + -1;
          end = end + 1;
          break;
        default:
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x21408d;
          local_1f5 = anon_unknown_10::numeric(cVar3);
          pcVar7 = orig_start;
          if (!(bool)local_1f5) {
            *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2140b1;
            boost::system::error_code::operator=(this_01,expected_value);
            if (ec != (error_code *)0x0) {
              ec->val_ = (int)end - (int)_current_frame;
            }
            goto LAB_00214472;
          }
          str_start = (char *)(long)(local_b1 + -0x30);
          pcStack_100 = end;
          pcVar11 = end + 1;
          end = pcVar11;
          if (orig_start <= pcVar11) {
            *(undefined8 *)((long)&uStack_280 + lVar2) = 0x214129;
            boost::system::error_code::operator=(this_01,unexpected_eof);
            if (ec != (error_code *)0x0) {
              ec->val_ = (int)end - (int)_current_frame;
            }
            goto LAB_00214472;
          }
          buff_size._4_4_ = no_error;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x21417e;
          local_200 = parse_int(pcVar11,pcVar7,':',(int64_t *)&str_start,
                                (error_code_enum *)((long)&buff_size + 4));
          eVar6 = buff_size._4_4_;
          end = local_200;
          if (buff_size._4_4_ != no_error) {
            *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2141af;
            boost::system::error_code::operator=(this_01,eVar6);
            if (ec != (error_code *)0x0) {
              ec->val_ = (int)end - (int)_current_frame;
            }
            goto LAB_00214472;
          }
          if (local_200 == orig_start) {
            *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2141f4;
            boost::system::error_code::operator=(this_01,expected_colon);
            if (ec != (error_code *)0x0) {
              ec->val_ = (int)end - (int)_current_frame;
            }
            goto LAB_00214472;
          }
          local_110 = orig_start + (-1 - (long)local_200);
          if ((long)local_110 < (long)str_start) {
            *(undefined8 *)((long)&uStack_280 + lVar2) = 0x214255;
            boost::system::error_code::operator=(this_01,unexpected_eof);
            if (ec != (error_code *)0x0) {
              ec->val_ = (int)end - (int)_current_frame;
            }
            goto LAB_00214472;
          }
          if ((long)str_start < 0) {
            *(undefined8 *)((long)&uStack_280 + lVar2) = 0x214294;
            boost::system::error_code::operator=(this_01,overflow);
            if (ec != (error_code *)0x0) {
              ec->val_ = (int)end - (int)_current_frame;
            }
            goto LAB_00214472;
          }
          end = local_200 + 1;
          if (7 < (long)(end + (-2 - (long)pcStack_100))) {
            *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2142f6;
            boost::system::error_code::operator=(this_01,limit_exceeded);
            if (ec != (error_code *)0x0) {
              ec->val_ = (int)end - (int)_current_frame;
            }
            goto LAB_00214472;
          }
          local_208 = local_150;
          lVar10 = (long)pcStack_100 - (long)_current_frame;
          cVar4 = (char)pcStack_100;
          cVar3 = (char)end;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x21435f;
          detail::bdecode_token::bdecode_token(&local_118,lVar10,1,string,cVar3 - cVar4);
          pbVar5 = local_208;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x214374;
          std::
          vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
          ::push_back((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       *)pbVar5,&local_118);
          end = str_start + (long)end;
          break;
        case 5:
          pcStack_d8 = end;
          local_dc = no_error;
          pcVar11 = end + 1;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213d4a;
          local_1c0 = anon_unknown_10::check_integer(pcVar11,pcVar7,&local_dc);
          eVar6 = local_dc;
          if (local_dc != no_error) {
            if (ec != (error_code *)0x0) {
              ec->val_ = (int)local_1c0 - (int)_current_frame;
            }
            end = pcStack_d8;
            *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213daf;
            boost::system::error_code::operator=(this_01,eVar6);
            goto LAB_00214472;
          }
          local_1c8 = local_150;
          lVar10 = (long)pcStack_d8 - (long)_current_frame;
          end = local_1c0;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213e0d;
          detail::bdecode_token::bdecode_token(&local_e4,lVar10,1,integer,'\x01');
          pbVar5 = local_1c8;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213e22;
          std::
          vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
          ::push_back((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       *)pbVar5,&local_e4);
          end = end + 1;
          break;
        case 8:
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213c7b;
          sVar13 = std::
                   vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   ::size((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                           *)pbVar5);
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213c89;
          anon_unknown_10::stack_frame::stack_frame(&local_c8,(int)sVar13);
          lVar10 = (long)local_40;
          local_40 = local_40 + 1;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213c9f;
          local_1b0 = span<libtorrent::(anonymous_namespace)::stack_frame>::operator[]
                                ((span<libtorrent::(anonymous_namespace)::stack_frame> *)
                                 &TORRENT_ALLOCA_size,lVar10);
          *local_1b0 = local_c8;
          local_1b8 = local_150;
          lVar10 = (long)end - (long)_current_frame;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213ce7;
          detail::bdecode_token::bdecode_token((bdecode_token *)&int_start,lVar10,list);
          pbVar5 = local_1b8;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x213cfc;
          std::
          vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
          ::push_back((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       *)pbVar5,(value_type *)&int_start);
          end = end + 1;
        }
        if (0 < local_b8) {
          local_218 = local_150;
          iVar8 = local_b8 + -1;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2143ba;
          local_210 = span<libtorrent::(anonymous_namespace)::stack_frame>::operator[]
                                ((span<libtorrent::(anonymous_namespace)::stack_frame> *)
                                 &TORRENT_ALLOCA_size,(long)iVar8);
          pbVar5 = local_218;
          sVar1 = *local_210;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2143e1;
          pvVar12 = std::
                    vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                    ::operator[]((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                                  *)pbVar5,(ulong)((uint)sVar1 & 0x7fffffff));
          if (((uint)((ulong)*pvVar12 >> 0x1d) & 7) == 1) {
            iVar8 = local_b8 + -1;
            *(undefined8 *)((long)&uStack_280 + lVar2) = 0x214405;
            local_220 = span<libtorrent::(anonymous_namespace)::stack_frame>::operator[]
                                  ((span<libtorrent::(anonymous_namespace)::stack_frame> *)
                                   &TORRENT_ALLOCA_size,(long)iVar8);
            local_22c = 1U - ((int)*local_220 >> 0x1f) & 1;
            iVar8 = local_b8 + -1;
            *(undefined8 *)((long)&uStack_280 + lVar2) = 0x214439;
            local_228 = span<libtorrent::(anonymous_namespace)::stack_frame>::operator[]
                                  ((span<libtorrent::(anonymous_namespace)::stack_frame> *)
                                   &TORRENT_ALLOCA_size,(long)iVar8);
            *local_228 = (stack_frame)((uint)*local_228 & 0x7fffffff | local_22c << 0x1f);
          }
        }
      } while (local_40 != 0);
    }
LAB_00214472:
    while (0 < local_40) {
      local_40 = local_40 + -1;
      local_240 = local_150;
      *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2144a5;
      local_238 = span<libtorrent::(anonymous_namespace)::stack_frame>::operator[]
                            ((span<libtorrent::(anonymous_namespace)::stack_frame> *)
                             &TORRENT_ALLOCA_size,(long)local_40);
      pbVar5 = local_240;
      sVar1 = *local_238;
      *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2144cc;
      pvVar12 = std::
                vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                ::operator[]((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                              *)pbVar5,(ulong)((uint)sVar1 & 0x7fffffff));
      if (((uint)((ulong)*pvVar12 >> 0x1d) & 7) == 1) {
        *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2144ed;
        local_248 = span<libtorrent::(anonymous_namespace)::stack_frame>::operator[]
                              ((span<libtorrent::(anonymous_namespace)::stack_frame> *)
                               &TORRENT_ALLOCA_size,(long)local_40);
        if ((int)*local_248 < 0) {
          local_250 = local_150;
          lVar10 = (long)end - (long)_current_frame;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x214543;
          detail::bdecode_token::bdecode_token(&local_120,lVar10,2,dict,'\0');
          pbVar5 = local_250;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x214558;
          std::
          vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
          ::push_back((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       *)pbVar5,&local_120);
          local_258 = local_150;
          lVar10 = (long)end - (long)_current_frame;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x21458a;
          detail::bdecode_token::bdecode_token((bdecode_token *)&stack0xfffffffffffffed8,lVar10,end)
          ;
          pbVar5 = local_258;
          *(undefined8 *)((long)&uStack_280 + lVar2) = 0x21459f;
          std::
          vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
          ::push_back((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       *)pbVar5,(value_type *)&stack0xfffffffffffffed8);
        }
      }
      *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2145b0;
      local_260 = span<libtorrent::(anonymous_namespace)::stack_frame>::operator[]
                            ((span<libtorrent::(anonymous_namespace)::stack_frame> *)
                             &TORRENT_ALLOCA_size,(long)local_40);
      pbVar5 = local_150;
      local_12c = (uint)*local_260 & 0x7fffffff;
      *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2145dd;
      sVar13 = std::
               vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
               ::size((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                       *)pbVar5);
      pbVar5 = local_150;
      __n = (size_type)(int)local_12c;
      local_26c = (int)sVar13 - local_12c;
      *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2145fa;
      pvVar12 = std::
                vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                ::operator[]((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                              *)pbVar5,__n);
      *pvVar12 = (value_type)
                 ((ulong)*pvVar12 & 0xe0000000ffffffff | (ulong)(local_26c & 0x1fffffff) << 0x20);
      local_268 = local_150;
      lVar10 = (long)end - (long)_current_frame;
      *(undefined8 *)((long)&uStack_280 + lVar2) = 0x21465d;
      detail::bdecode_token::bdecode_token(&local_134,lVar10,1,end,'\0');
      pbVar5 = local_268;
      *(undefined8 *)((long)&uStack_280 + lVar2) = 0x214672;
      std::
      vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
      ::push_back((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   *)pbVar5,&local_134);
    }
    local_278 = local_150;
    lVar10 = (long)end - (long)_current_frame;
    *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2146af;
    detail::bdecode_token::bdecode_token(&local_13c,lVar10,0,end,'\0');
    pbVar5 = local_278;
    *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2146c4;
    std::
    vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>::
    push_back((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
               *)pbVar5,&local_13c);
    pbVar5 = local_150;
    local_150->m_token_idx = 0;
    local_150->m_buffer = _current_frame;
    local_150->m_buffer_size = (int)end - (int)_current_frame;
    *(undefined8 *)((long)&uStack_280 + lVar2) = 0x2146f8;
    pbVar14 = std::
              vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
              ::data((vector<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                      *)pbVar5);
    local_150->m_root_tokens = pbVar14;
    *(undefined8 *)((long)&uStack_280 + lVar2) = 0x21471d;
    aux::alloca_destructor<libtorrent::(anonymous_namespace)::stack_frame>::~alloca_destructor
              ((alloca_destructor<libtorrent::(anonymous_namespace)::stack_frame> *)&start);
  }
  else {
    if (ec != (error_code *)0x0) {
      ec->val_ = 0;
    }
    uStack_280 = 0x213829;
    boost::system::error_code::operator=(this_01,limit_exceeded);
  }
  return local_148;
}

Assistant:

bdecode_node bdecode(span<char const> buffer
		, error_code& ec, int* error_pos, int depth_limit, int token_limit)
	{
		bdecode_node ret;
		ec.clear();

		if (buffer.size() > bdecode_token::max_offset)
		{
			if (error_pos) *error_pos = 0;
			ec = bdecode_errors::limit_exceeded;
			return ret;
		}

		// this is the stack of bdecode_token indices, into m_tokens.
		// sp is the stack pointer, as index into the array, stack
		int sp = 0;
		TORRENT_ALLOCA(stack, stack_frame, depth_limit);

		// TODO: 2 attempt to simplify this implementation by embracing the span
		char const* start = buffer.data();
		char const* end = start + buffer.size();
		char const* const orig_start = start;

		if (start == end)
			TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);

		while (start <= end)
		{
			if (start >= end) TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);

			if (sp >= depth_limit)
				TORRENT_FAIL_BDECODE(bdecode_errors::depth_exceeded);

			--token_limit;
			if (token_limit < 0)
				TORRENT_FAIL_BDECODE(bdecode_errors::limit_exceeded);

			// look for a new token
			char const t = *start;

			int const current_frame = sp;

			// if we're currently parsing a dictionary, assert that
			// every other node is a string.
			if (current_frame > 0
				&& ret.m_tokens[stack[current_frame - 1].token].type == bdecode_token::dict)
			{
				if (stack[current_frame - 1].state == 0)
				{
					// the current parent is a dict and we are parsing a key.
					// only allow a digit (for a string) or 'e' to terminate
					if (!numeric(t) && t != 'e')
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_digit);
				}
			}

			switch (t)
			{
				case 'd':
					stack[sp++] = stack_frame(int(ret.m_tokens.size()));
					// we push it into the stack so that we know where to fill
					// in the next_node field once we pop this node off the stack.
					// i.e. get to the node following the dictionary in the buffer
					ret.m_tokens.push_back({start - orig_start, bdecode_token::dict});
					++start;
					break;
				case 'l':
					stack[sp++] = stack_frame(int(ret.m_tokens.size()));
					// we push it into the stack so that we know where to fill
					// in the next_node field once we pop this node off the stack.
					// i.e. get to the node following the list in the buffer
					ret.m_tokens.push_back({start - orig_start, bdecode_token::list});
					++start;
					break;
				case 'i':
				{
					char const* const int_start = start;
					bdecode_errors::error_code_enum e = bdecode_errors::no_error;
					// +1 here to point to the first digit, rather than 'i'
					start = check_integer(start + 1, end, e);
					if (e)
					{
						// in order to gracefully terminate the tree,
						// make sure the end of the previous token is set correctly
						if (error_pos) *error_pos = int(start - orig_start);
						error_pos = nullptr;
						start = int_start;
						TORRENT_FAIL_BDECODE(e);
					}
					ret.m_tokens.push_back({int_start - orig_start
						, 1, bdecode_token::integer, 1});
					TORRENT_ASSERT(*start == 'e');

					// skip 'e'
					++start;
					break;
				}
				case 'e':
				{
					// this is the end of a list or dict
					if (sp == 0)
						TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);

					if (sp > 0
						&& ret.m_tokens[stack[sp - 1].token].type == bdecode_token::dict
						&& stack[sp - 1].state == 1)
					{
						// this means we're parsing a dictionary and about to parse a
						// value associated with a key. Instead, we got a termination
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_value);
					}

					// insert the end-of-sequence token
					ret.m_tokens.push_back({start - orig_start, 1, bdecode_token::end});

					// and back-patch the start of this sequence with the offset
					// to the next token we'll insert
					int const top = stack[sp - 1].token;
					// subtract the token's own index, since this is a relative
					// offset
					if (int(ret.m_tokens.size()) - top > bdecode_token::max_next_item)
						TORRENT_FAIL_BDECODE(bdecode_errors::limit_exceeded);

					ret.m_tokens[std::size_t(top)].next_item = std::uint32_t(int(ret.m_tokens.size()) - top);

					// and pop it from the stack.
					TORRENT_ASSERT(sp > 0);
					--sp;
					++start;
					break;
				}
				default:
				{
					// this is the case for strings. The start character is any
					// numeric digit
					if (!numeric(t))
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_value);

					std::int64_t len = t - '0';
					char const* const str_start = start;
					++start;
					if (start >= end) TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);
					bdecode_errors::error_code_enum e = bdecode_errors::no_error;
					start = parse_int(start, end, ':', len, e);
					if (e)
						TORRENT_FAIL_BDECODE(e);
					if (start == end)
						TORRENT_FAIL_BDECODE(bdecode_errors::expected_colon);

					// remaining buffer size excluding ':'
					ptrdiff_t const buff_size = end - start - 1;
					if (len > buff_size)
						TORRENT_FAIL_BDECODE(bdecode_errors::unexpected_eof);
					if (len < 0)
						TORRENT_FAIL_BDECODE(bdecode_errors::overflow);

					// skip ':'
					++start;
					// no need to range check start here
					// the check above ensures that the buffer is long enough to hold
					// the string's length which guarantees that start <= end

					// the bdecode_token only has 8 bits to keep the header size
					// in. If it overflows, fail!
					if (start - str_start - 2 > detail::bdecode_token::max_header)
						TORRENT_FAIL_BDECODE(bdecode_errors::limit_exceeded);

					ret.m_tokens.push_back({str_start - orig_start
						, 1, bdecode_token::string, std::uint8_t(start - str_start)});
					start += len;
					break;
				}
			}

			if (current_frame > 0
				&& ret.m_tokens[stack[current_frame - 1].token].type == bdecode_token::dict)
			{
				// the next item we parse is the opposite
				// state is an unsigned 1-bit member. adding 1 will flip the bit
				stack[current_frame - 1].state = (stack[current_frame - 1].state + 1) & 1;
			}

			// this terminates the top level node, we're done!
			if (sp == 0) break;
		}

done:

		// if parse failed, sp will be greater than 1
		// unwind the stack by inserting terminator to make whatever we have
		// so far valid
		while (sp > 0) {
			TORRENT_ASSERT(ec);
			--sp;

			// we may need to insert a dummy token to properly terminate the tree,
			// in case we just parsed a key to a dict and failed in the value
			if (ret.m_tokens[stack[sp].token].type == bdecode_token::dict
				&& stack[sp].state == 1)
			{
				// insert an empty dictionary as the value
				ret.m_tokens.push_back({start - orig_start, 2, bdecode_token::dict});
				ret.m_tokens.push_back({start - orig_start, bdecode_token::end});
			}

			int const top = stack[sp].token;
			TORRENT_ASSERT(int(ret.m_tokens.size()) - top <= bdecode_token::max_next_item);
			ret.m_tokens[std::size_t(top)].next_item = std::uint32_t(int(ret.m_tokens.size()) - top);
			ret.m_tokens.push_back({start - orig_start, 1, bdecode_token::end});
		}

		ret.m_tokens.push_back({start - orig_start, 0, bdecode_token::end});

		ret.m_token_idx = 0;
		ret.m_buffer = orig_start;
		ret.m_buffer_size = int(start - orig_start);
		ret.m_root_tokens = ret.m_tokens.data();

		return ret;
	}